

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Reader * __thiscall
capnp::Orphan<capnp::DynamicList>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicList> *this)

{
  ulong uVar1;
  anon_union_8_2_eba6ea51_for_Type_5 aVar2;
  ElementSize elementSize;
  Which elementType;
  
  uVar1._0_2_ = (this->schema).elementType.baseType;
  uVar1._2_1_ = (this->schema).elementType.listDepth;
  uVar1._3_1_ = (this->schema).elementType.isImplicitParam;
  uVar1._4_2_ = (this->schema).elementType.field_3;
  uVar1._6_2_ = *(undefined2 *)&(this->schema).elementType.field_0x6;
  aVar2 = (this->schema).elementType.field_4;
  elementType = LIST;
  if ((uVar1 & 0xff0000) == 0) {
    elementType = (undefined2)uVar1;
  }
  elementSize = anon_unknown_71::elementSizeFor(elementType);
  _::OrphanBuilder::asListReader(&__return_storage_ptr__->reader,&this->builder,elementSize);
  (__return_storage_ptr__->schema).elementType.baseType = (undefined2)uVar1;
  (__return_storage_ptr__->schema).elementType.listDepth = uVar1._2_1_;
  (__return_storage_ptr__->schema).elementType.isImplicitParam = (bool)uVar1._3_1_;
  (__return_storage_ptr__->schema).elementType.field_3 =
       (anon_union_2_2_d12d5221_for_Type_3)uVar1._4_2_;
  *(undefined2 *)&(__return_storage_ptr__->schema).elementType.field_0x6 = uVar1._6_2_;
  (__return_storage_ptr__->schema).elementType.field_4 = aVar2;
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Reader Orphan<DynamicList>::getReader() const {
  return DynamicList::Reader(
      schema, builder.asListReader(elementSizeFor(schema.whichElementType())));
}